

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

int __thiscall
booster::
sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::compare(sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *other)

{
  int iVar1;
  string_type sStack_48;
  string_type local_28;
  
  str(&local_28,this);
  str(&sStack_48,other);
  iVar1 = std::__cxx11::string::compare((string *)&local_28);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

int compare(sub_match const &other) const
		{
			return str().compare(other.str());
		}